

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::NetworkUpdateParameters::_InternalSerialize
          (NetworkUpdateParameters *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int size;
  uint8_t *puVar3;
  LossLayer *value;
  Optimizer *value_00;
  BoolParameter *value_01;
  Int64Parameter *pIVar4;
  void *data;
  uint local_28;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  NetworkUpdateParameters *this_local;
  
  local_28 = 0;
  uVar2 = _internal_losslayers_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; local_28 < uVar2; local_28 = local_28 + 1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _internal_losslayers(this,local_28);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::LossLayer>(1,value,puVar3,stream);
  }
  bVar1 = _internal_has_optimizer(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _Internal::optimizer(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::Optimizer>(2,value_00,puVar3,stream);
  }
  bVar1 = _internal_has_epochs(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pIVar4 = _Internal::epochs(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::Int64Parameter>
                             (3,pIVar4,puVar3,stream);
  }
  bVar1 = _internal_has_shuffle(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_01 = _Internal::shuffle(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::BoolParameter>
                             (10,value_01,puVar3,stream);
  }
  bVar1 = _internal_has_seed(this);
  if (bVar1) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    pIVar4 = _Internal::seed(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::Int64Parameter>
                             (0x14,pIVar4,puVar3,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* NetworkUpdateParameters::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.NetworkUpdateParameters)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.LossLayer lossLayers = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_losslayers_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_losslayers(i), target, stream);
  }

  // .CoreML.Specification.Optimizer optimizer = 2;
  if (this->_internal_has_optimizer()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::optimizer(this), target, stream);
  }

  // .CoreML.Specification.Int64Parameter epochs = 3;
  if (this->_internal_has_epochs()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::epochs(this), target, stream);
  }

  // .CoreML.Specification.BoolParameter shuffle = 10;
  if (this->_internal_has_shuffle()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        10, _Internal::shuffle(this), target, stream);
  }

  // .CoreML.Specification.Int64Parameter seed = 20;
  if (this->_internal_has_seed()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        20, _Internal::seed(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.NetworkUpdateParameters)
  return target;
}